

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O3

int mjs::function_object::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  gc_heap *h;
  allocation_context *paVar1;
  uint32_t uVar2;
  void *pvVar3;
  bound_function_args *this;
  function_object *this_00;
  void *pvVar4;
  long *plVar5;
  long *plVar6;
  int iVar7;
  int named_args;
  undefined4 in_register_0000003c;
  gc_heap_ptr<mjs::function_object> res;
  value p;
  gc_heap_ptr<mjs::bound_function_args> bound_args;
  gc_heap_ptr<mjs::global_object> global;
  gc_heap_ptr_untyped local_f8;
  undefined1 local_e8 [16];
  gc_heap_ptr_untyped local_d8;
  undefined1 local_c0 [24];
  pointer local_a8;
  gc_heap_ptr_untyped local_a0;
  gc_heap_ptr_untyped local_90;
  gc_heap_ptr_untyped local_80;
  gc_heap_ptr_untyped local_70;
  undefined1 local_60 [40];
  allocation_context *local_38;
  
  h = *(gc_heap **)__addr;
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)__addr);
  gc_heap::unsafe_create_from_position<mjs::global_object>((gc_heap *)&local_70,(uint32_t)h);
  gc_heap::
  allocate_and_construct<mjs::bound_function_args,mjs::gc_heap&,std::vector<mjs::value,std::allocator<mjs::value>>const&>
            ((gc_heap *)local_c0,(size_t)h,(gc_heap *)0x18,
             (vector<mjs::value,_std::allocator<mjs::value>_> *)h);
  local_e8._0_8_ = *(undefined8 *)__addr;
  local_e8._8_4_ = *(undefined4 *)(__addr->sa_data + 6);
  if ((gc_heap *)local_e8._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_e8._0_8_,(gc_heap_ptr_untyped *)local_e8);
  }
  local_d8.heap_ = (gc_heap *)local_c0._0_8_;
  local_d8.pos_ = local_c0._8_4_;
  if ((slot *)local_c0._0_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_c0._0_8_,&local_d8);
  }
  local_c0._16_8_ = (slot *)0x0;
  local_a8 = (pointer)0x1b2b64;
  string::string((string *)&local_a0,h,(string_view *)(local_c0 + 0x10));
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)__addr);
  iVar7 = *(int *)((long)pvVar3 + 0x40);
  this = (bound_function_args *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
  uVar2 = bound_function_args::bound_args_len(this);
  iVar7 = iVar7 - uVar2;
  named_args = 0;
  if (0 < iVar7) {
    named_args = iVar7;
  }
  make_raw_function((mjs *)&local_f8,(gc_heap_ptr<mjs::global_object> *)&local_70);
  this_00 = (function_object *)gc_heap_ptr_untyped::get(&local_f8);
  local_90.heap_ = (gc_heap *)0x0;
  local_90.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_60,(size_t)(this_00->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_60);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001f1a78;
  *(undefined8 *)((long)pvVar3 + 0x10) = local_e8._0_8_;
  *(undefined4 *)((long)pvVar3 + 0x18) = local_e8._8_4_;
  if ((gc_heap *)local_e8._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_e8._0_8_,(gc_heap_ptr_untyped *)((long)pvVar3 + 0x10));
  }
  *(gc_heap **)((long)pvVar3 + 0x20) = local_d8.heap_;
  *(uint32_t *)((long)pvVar3 + 0x28) = local_d8.pos_;
  local_38 = (allocation_context *)CONCAT44(in_register_0000003c,__fd);
  if ((slot *)local_d8.heap_ != (slot *)0x0) {
    gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)((long)pvVar3 + 0x20));
  }
  put_function(this_00,(gc_heap_ptr<mjs::gc_function> *)local_60,
               (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_90,
               named_args);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  local_90.heap_ = *(gc_heap **)__addr;
  local_90.pos_ = *(uint32_t *)(__addr->sa_data + 6);
  if (local_90.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_90.heap_,&local_90);
  }
  local_80.heap_ = (gc_heap *)local_c0._0_8_;
  local_80.pos_ = local_c0._8_4_;
  if ((slot *)local_c0._0_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_c0._0_8_,&local_80);
  }
  pvVar3 = gc_heap_ptr_untyped::get(&local_f8);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_e8,*(size_t *)((long)pvVar3 + 8));
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e8);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001f1ab8;
  *(gc_heap **)((long)pvVar4 + 0x10) = local_90.heap_;
  *(uint32_t *)((long)pvVar4 + 0x18) = local_90.pos_;
  if (local_90.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
  }
  *(gc_heap **)((long)pvVar4 + 0x20) = local_80.heap_;
  *(uint32_t *)((long)pvVar4 + 0x28) = local_80.pos_;
  if ((slot *)local_80.heap_ != (slot *)0x0) {
    gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
  }
  if ((*(int *)((long)pvVar3 + 0x28) == 0) && ((gc_heap *)local_e8._0_8_ != (gc_heap *)0x0)) {
    *(undefined4 *)((long)pvVar3 + 0x28) = local_e8._8_4_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
    pvVar3 = gc_heap_ptr_untyped::get(&local_f8);
    value_representation::get_value
              ((value *)local_e8,(value_representation *)((long)pvVar3 + 0x38),
               *(gc_heap **)((long)pvVar3 + 8));
    if (local_e8._0_4_ != object) {
      __assert_fail("p.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                    ,0x59,
                    "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:174:37)]"
                   );
    }
    pvVar3 = gc_heap_ptr_untyped::get(&local_70);
    if (*(int *)((long)pvVar3 + 0x20) < 1) {
      if (local_e8._0_4_ != object) {
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_e8 + 8));
      plVar6 = (long *)gc_heap_ptr_untyped::get(&local_70);
      (**(code **)(*plVar6 + 0x98))(&local_a0,plVar6,"constructor");
      local_c0._16_8_ = local_f8.heap_;
      local_a8 = (pointer)CONCAT44(local_a8._4_4_,local_f8.pos_);
      if ((slot *)local_f8.heap_ == (slot *)0x0) {
        local_60._0_4_ = object;
        local_60._8_8_ = (slot *)0x0;
        local_60._16_4_ = local_f8.pos_;
      }
      else {
        gc_heap::attach(local_f8.heap_,(gc_heap_ptr_untyped *)(local_c0 + 0x10));
        local_60._0_4_ = object;
        local_60._8_8_ = local_c0._16_8_;
        local_60._16_4_ = (uint32_t)local_a8;
        if ((slot *)local_c0._16_8_ != (slot *)0x0) {
          gc_heap::attach((gc_heap *)local_c0._16_8_,(gc_heap_ptr_untyped *)(local_60 + 8));
        }
      }
      (**(code **)(*plVar5 + 8))(plVar5,&local_a0,local_60,2);
      value::destroy((value *)local_60);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c0 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    }
    value::destroy((value *)local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    paVar1 = local_38;
    local_38->storage_ = (slot *)local_f8.heap_;
    local_38->capacity_ = local_f8.pos_;
    if ((slot *)local_f8.heap_ != (slot *)0x0) {
      gc_heap::attach(local_f8.heap_,(gc_heap_ptr_untyped *)local_38);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
    return (int)paVar1;
  }
  __assert_fail("!construct_ && f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x45,
                "void mjs::function_object::construct_function(const gc_heap_ptr<gc_function> &)");
}

Assistant:

object_ptr function_object::bind(const gc_heap_ptr<function_object>& f, const std::vector<value>& args) {
    auto& h = f.heap();
    auto global = f->global_.track(h);
    auto bound_args = h.make<bound_function_args>(h, args);

    // Actually need to create object to store "args" (thisArg and the extra (needed?) arguments)
    // Put it in a special pointer in function? (will help with the type checks)

    // ES5.1, 15.3.4.5
    auto res = make_function(global, [f, bound_args](const value&, const std::vector<value>& args) {
        return f->call(bound_args->bound_this(), bound_args->build_args(args));
    }, string{h,""}.unsafe_raw_get(), std::max(0,  f->named_args_ - static_cast<int>(bound_args->bound_args_len())));

    make_constructable(global, res, [f, bound_args](const value&, const std::vector<value>& args) {
        return f->construct(value::undefined, bound_args->build_args(args));
    });
    
    return res;
}